

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_p_h_m_weighted_by_squared_diag_distance.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer pvVar1;
  int iVar2;
  ostream *poVar3;
  pointer pvVar4;
  reference ppcVar5;
  char *pcVar6;
  double min__00;
  double max__00;
  double dVar7;
  string local_2e8 [32];
  stringstream local_2c8 [8];
  stringstream ss;
  ostream local_2b8 [376];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_140;
  undefined1 local_128 [8];
  Persistence_heat_maps l;
  size_t i_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  int dim;
  uint dimension;
  size_t stdiv;
  double max_;
  double min_;
  size_t size_of_grid;
  char **argv_local;
  int argc_local;
  
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "This program creates persistence heat map files (*.mps) of persistence diagrams files (*.pers) "
                          );
  poVar3 = std::operator<<(poVar3,
                           "provided as an input.The Gaussian kernels are weighted by the square of distance of a center from the "
                          );
  poVar3 = std::operator<<(poVar3,"diagonal.\n");
  poVar3 = std::operator<<(poVar3,
                           "The first parameter of a program is an integer, a size of a grid.\n");
  poVar3 = std::operator<<(poVar3,
                           "The second and third parameters are min and max of the grid. If you want those numbers to be computed "
                          );
  poVar3 = std::operator<<(poVar3,"based on the data, set them both to -1 \n");
  poVar3 = std::operator<<(poVar3,
                           "The fourth parameter is an integer, the standard deviation of a Gaussian kernel expressed in a number "
                          );
  poVar3 = std::operator<<(poVar3,"of pixels.\n");
  poVar3 = std::operator<<(poVar3,
                           "The fifth parameter of this program is a dimension of persistence that will be used in creation of "
                          );
  poVar3 = std::operator<<(poVar3,"the persistence heat maps.");
  poVar3 = std::operator<<(poVar3,
                           "If your input files contains persistence pairs of various dimension, as a fifth parameter of the "
                          );
  poVar3 = std::operator<<(poVar3,
                           "procedure please provide the dimension of persistence you want to use.")
  ;
  poVar3 = std::operator<<(poVar3,
                           "If in your files there are only birth-death pairs of the same dimension, set the fifth parameter to "
                          );
  poVar3 = std::operator<<(poVar3,"-1.\n");
  std::operator<<(poVar3,
                  "The remaining parameters are the names of files with persistence diagrams. \n");
  if (argc < 7) {
    std::operator<<((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n")
    ;
    argv_local._4_4_ = 1;
  }
  else {
    iVar2 = atoi(argv[1]);
    min__00 = atof(argv[2]);
    max__00 = atof(argv[3]);
    dVar7 = atof(argv[4]);
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = std::numeric_limits<unsigned_int>::max();
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = atoi(argv[5]);
    if (-1 < (int)(uint)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           (uint)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
    for (local_5c = 6; local_5c < argc; local_5c = local_5c + 1) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,argv + local_5c);
    }
    Gudhi::Persistence_representations::create_Gaussian_filter
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&i_1,(long)dVar7 | (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f,1.0
              );
    l.heat_map.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      pvVar1 = l.heat_map.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar4 = (pointer)std::vector<const_char_*,_std::allocator<const_char_*>_>::size
                                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
      if (pvVar1 == pvVar4) break;
      poVar3 = std::operator<<((ostream *)&std::clog,"Creating a heat map based on a file : ");
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,
                           (size_type)
                           l.heat_map.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar3 = std::operator<<(poVar3,*ppcVar5);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,
                           (size_type)
                           l.heat_map.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar6 = *ppcVar5;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_140,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&i_1);
      Gudhi::Persistence_representations::
      Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
      ::Persistence_heat_maps
                ((Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
                  *)local_128,pcVar6,&local_140,false,(long)iVar2,min__00,max__00,
                 filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_140);
      std::__cxx11::stringstream::stringstream(local_2c8);
      ppcVar5 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58,
                           (size_type)
                           l.heat_map.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar3 = std::operator<<(local_2b8,*ppcVar5);
      std::operator<<(poVar3,".mps");
      std::__cxx11::stringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Gudhi::Persistence_representations::
      Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
      ::print_to_file((Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
                       *)local_128,pcVar6);
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::stringstream::~stringstream(local_2c8);
      Gudhi::Persistence_representations::
      Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
      ::~Persistence_heat_maps
                ((Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
                  *)local_128);
      l.heat_map.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((l.heat_map.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + 1);
    }
    argv_local._4_4_ = 0;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&i_1);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_58);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates persistence heat map files (*.mps) of persistence diagrams files (*.pers) "
            << "provided as an input.The Gaussian kernels are weighted by the square of distance of a center from the "
            << "diagonal.\n"
            << "The first parameter of a program is an integer, a size of a grid.\n"
            << "The second and third parameters are min and max of the grid. If you want those numbers to be computed "
            << "based on the data, set them both to -1 \n"
            << "The fourth parameter is an integer, the standard deviation of a Gaussian kernel expressed in a number "
            << "of pixels.\n"
            << "The fifth parameter of this program is a dimension of persistence that will be used in creation of "
            << "the persistence heat maps."
            << "If your input files contains persistence pairs of various dimension, as a fifth parameter of the "
            << "procedure please provide the dimension of persistence you want to use."
            << "If in your files there are only birth-death pairs of the same dimension, set the fifth parameter to "
            << "-1.\n"
            << "The remaining parameters are the names of files with persistence diagrams. \n";

  if (argc < 7) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }

  size_t size_of_grid = (size_t)atoi(argv[1]);
  double min_ = atof(argv[2]);
  double max_ = atof(argv[3]);
  size_t stdiv = atof(argv[4]);

  unsigned dimension = std::numeric_limits<unsigned>::max();
  int dim = atoi(argv[5]);
  if (dim >= 0) {
    dimension = (unsigned)dim;
  }

  std::vector<const char*> filenames;
  for (int i = 6; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }

  std::vector<std::vector<double> > filter = Gudhi::Persistence_representations::create_Gaussian_filter(stdiv, 1);
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::clog << "Creating a heat map based on a file : " << filenames[i] << std::endl;
    Persistence_heat_maps l(filenames[i], filter, false, size_of_grid, min_, max_, dimension);

    std::stringstream ss;
    ss << filenames[i] << ".mps";
    l.print_to_file(ss.str().c_str());
  }
  return 0;
}